

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdn.c
# Opt level: O0

void Qiniu_Free_CDNLogListRet(Qiniu_CDN_LogListRet *ret)

{
  int local_14;
  int i;
  Qiniu_CDN_LogListRet *ret_local;
  
  if (ret->data != (_Qiniu_CDN_LogListData *)0x0) {
    for (local_14 = 0; local_14 < ret->domainsCount; local_14 = local_14 + 1) {
      if (0 < ret->data[local_14].itemsCount) {
        Qiniu_Free(ret->data[local_14].items);
      }
    }
    Qiniu_Free(ret->data);
  }
  return;
}

Assistant:

void Qiniu_Free_CDNLogListRet(Qiniu_CDN_LogListRet *ret) {
    int i;
    if (ret->data != NULL) {
        for (i = 0; i < ret->domainsCount; i++) {
            if (ret->data[i].itemsCount > 0) {
                Qiniu_Free(ret->data[i].items);
            }
        }
        Qiniu_Free(ret->data);
    }
}